

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O2

vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::PhysicalUnion::GetSources
          (vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>
           *__return_storage_ptr__,PhysicalUnion *this)

{
  pointer prVar1;
  pointer prVar2;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> child_sources;
  __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
  local_38;
  __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
  local_30;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prVar1 = (this->super_PhysicalOperator).children.
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar2 = (this->super_PhysicalOperator).children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar2 != prVar1; prVar2 = prVar2 + 1) {
    (*prVar2->_M_data->_vptr_PhysicalOperator[0x25])(&local_38);
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator_const>*,std::vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>>,void>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
               ).
               super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,local_38,local_30);
    std::
    _Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                     *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<const_reference<PhysicalOperator>> PhysicalUnion::GetSources() const {
	vector<const_reference<PhysicalOperator>> result;
	for (auto &child : children) {
		auto child_sources = child.get().GetSources();
		result.insert(result.end(), child_sources.begin(), child_sources.end());
	}
	return result;
}